

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O2

void Fl::background(uchar r,uchar g,uchar b)

{
  byte bVar1;
  undefined7 in_register_00000039;
  int iVar2;
  int i;
  uint uVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  fl_bg_set = 1;
  dVar5 = 1.0;
  if ((int)CONCAT71(in_register_00000039,r) != 0) {
    bVar1 = 0xfe;
    if (r < 0xfe) {
      bVar1 = r;
    }
    dVar5 = (double)bVar1;
  }
  dVar5 = log(dVar5 / 255.0);
  dVar6 = 1.0;
  if (g != '\0') {
    bVar1 = 0xfe;
    if (g < 0xfe) {
      bVar1 = g;
    }
    dVar6 = (double)bVar1;
  }
  dVar6 = log(dVar6 / 255.0);
  dVar7 = 1.0;
  if (b != '\0') {
    bVar1 = 0xfe;
    if (b < 0xfe) {
      bVar1 = b;
    }
    dVar7 = (double)bVar1;
  }
  dVar7 = log(dVar7 / 255.0);
  uVar3 = 0;
  dVar11 = 0.0;
  iVar2 = 0x18;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    dVar8 = dVar11 / 23.0;
    dVar9 = pow(dVar8,dVar5 / -0.3022808718729337);
    dVar10 = pow(dVar8,dVar6 / -0.3022808718729337);
    dVar8 = pow(dVar8,dVar7 / -0.3022808718729337);
    set_color(uVar3 | 0x20,(uchar)(int)(dVar9 * 255.0 + 0.5),(uchar)(int)(dVar10 * 255.0 + 0.5),
              (uchar)(int)(dVar8 * 255.0 + 0.5));
    dVar11 = dVar11 + 1.0;
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void Fl::background(uchar r, uchar g, uchar b) {
  fl_bg_set = 1;

  // replace the gray ramp so that FL_GRAY is this color
  if (!r) r = 1; else if (r==255) r = 254;
  double powr = log(r/255.0)/log((FL_GRAY-FL_GRAY_RAMP)/(FL_NUM_GRAY-1.0));
  if (!g) g = 1; else if (g==255) g = 254;
  double powg = log(g/255.0)/log((FL_GRAY-FL_GRAY_RAMP)/(FL_NUM_GRAY-1.0));
  if (!b) b = 1; else if (b==255) b = 254;
  double powb = log(b/255.0)/log((FL_GRAY-FL_GRAY_RAMP)/(FL_NUM_GRAY-1.0));
  for (int i = 0; i < FL_NUM_GRAY; i++) {
    double gray = i/(FL_NUM_GRAY-1.0);
    Fl::set_color(fl_gray_ramp(i),
		  uchar(pow(gray,powr)*255+.5),
		  uchar(pow(gray,powg)*255+.5),
		  uchar(pow(gray,powb)*255+.5));
  }
}